

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_net.c
# Opt level: O1

int socket_bytes_available(int socket)

{
  int iVar1;
  int n;
  undefined4 local_4;
  
  iVar1 = ioctl(socket,0x541b);
  local_4 = -1;
  if (-1 < iVar1) {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int socket_bytes_available(int socket)
{
#ifdef _WIN32
    u_long n = 0;
    if (ioctlsocket(socket, FIONREAD, &n) != NO_ERROR)
        return -1;
    return n;
#else
    int n = 0;
    if (ioctl(socket, FIONREAD, &n) < 0)
        return -1;
    return n;
#endif
}